

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void map_put(Map *map,void *key,void *value)

{
  List *pLVar1;
  ListNode *pLVar2;
  undefined8 *data;
  void **ppvVar3;
  ulong uVar4;
  
  uVar4 = (ulong)key % (ulong)map->prime;
  ppvVar3 = map->elem;
  if (ppvVar3[uVar4] == (void *)0x0) {
    pLVar1 = new_list();
    map->elem[uVar4] = pLVar1;
    ppvVar3 = map->elem;
    uVar4 = (ulong)key % (ulong)map->prime;
  }
  pLVar1 = (List *)ppvVar3[uVar4];
  pLVar2 = pLVar1->head;
  while( true ) {
    if (pLVar2 == (ListNode *)0x0) {
      data = (undefined8 *)malloc(0x10);
      *data = key;
      data[1] = value;
      list_add(pLVar1,data);
      map->size = map->size + 1;
      return;
    }
    if (*pLVar2->data == key) break;
    pLVar2 = pLVar2->next;
  }
  *(void **)((long)pLVar2->data + 8) = value;
  return;
}

Assistant:

void map_put(Map *map, void *key, void *value) {
    uint pos = hash_fun(key, map->prime);
    if (map->elem[pos] == NULL) {
        map->elem[pos] = new_list();
    }
    List *els = map_get_(map, key);
    Elem *elem;
    ListNode *node = els->head;
    while (node != NULL) {
        elem = node->data;
        if (hash(key) == hash(elem->key)) {
            elem->value = value;
            return;
        }
        node = node->next;
    }
    list_add(els, new_elem(key, value));
    map->size++;
}